

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSweep.c
# Opt level: O3

int Cec_ManFraClassesUpdate(Cec_ManFra_t *p,Cec_ManSim_t *pSim,Cec_ManPat_t *pPat,Gia_Man_t *pNew)

{
  uint uVar1;
  uint uVar2;
  Gia_Rpr_t GVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  int *piVar6;
  Gia_Obj_t *pGVar7;
  int iVar8;
  int iVar9;
  Vec_Ptr_t *vInfo;
  Vec_Int_t *pVVar10;
  Gia_Man_t *pGVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar8 = clock_gettime(3,&local_48);
  if (iVar8 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  vInfo = Cec_ManPatCollectPatterns(pPat,p->pAig->vCis->nSize,pSim->nWords);
  iVar8 = clock_gettime(3,&local_48);
  if (iVar8 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timePat = p->timePat + lVar13 + lVar12;
  iVar8 = clock_gettime(3,&local_48);
  if (iVar8 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (vInfo != (Vec_Ptr_t *)0x0) {
    local_38 = lVar12;
    Gia_ManCreateValueRefs(p->pAig);
    if (0 < pPat->nSeries) {
      iVar8 = 0;
      do {
        Cec_ManFraCreateInfo(pSim,pSim->vCiSimInfo,vInfo,iVar8);
        iVar9 = Cec_ManSimSimulateRound(pSim,pSim->vCiSimInfo,pSim->vCoSimInfo);
        if (iVar9 != 0) {
          if (vInfo->pArray != (void **)0x0) {
            free(vInfo->pArray);
          }
          free(vInfo);
          return 1;
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < pPat->nSeries);
    }
    if (vInfo->pArray != (void **)0x0) {
      free(vInfo->pArray);
    }
    free(vInfo);
    lVar12 = local_38;
  }
  iVar8 = clock_gettime(3,&local_48);
  if (iVar8 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeSim = p->timeSim + lVar13 + lVar12;
  pVVar10 = pNew->vCos;
  if (p->vXorNodes->nSize != pVVar10->nSize * 2) {
    __assert_fail("Vec_IntSize(p->vXorNodes) == 2*Gia_ManCoNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                  ,0xd5,
                  "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                 );
  }
  if (p->pPars->nDepthMax != 1) {
    Gia_ManCleanMark0(p->pAig);
    Gia_ManCleanMark1(p->pAig);
    pVVar10 = pNew->vCos;
    if (0 < pVVar10->nSize) {
      lVar12 = 0;
      lVar13 = 0;
      do {
        iVar8 = *(int *)((long)pVVar10->pArray + lVar12 * 2);
        if (((long)iVar8 < 0) || (pNew->nObjs <= iVar8)) goto LAB_006605e6;
        if (pNew->pObjs == (Gia_Obj_t *)0x0) break;
        uVar1 = p->vXorNodes->nSize;
        if (((int)uVar1 <= (int)lVar12) || ((ulong)uVar1 <= lVar12 + 1U)) goto LAB_00660605;
        if (((undefined1  [12])pNew->pObjs[iVar8] & (undefined1  [12])0x4000000040000000) !=
            (undefined1  [12])0x4000000000000000) {
          uVar1 = p->vXorNodes->pArray[lVar12 + 1];
          if (((int)uVar1 < 0) || (p->pAig->nObjs <= (int)uVar1)) goto LAB_006605e6;
          pGVar4 = p->pAig->pObjs + uVar1;
          *(ulong *)pGVar4 = *(ulong *)pGVar4 | 0x40000000;
          pVVar10 = pNew->vCos;
        }
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + 2;
      } while (lVar13 < pVVar10->nSize);
    }
    pGVar11 = p->pAig;
    if (0 < pGVar11->nObjs) {
      lVar12 = 0;
      lVar13 = 0;
      do {
        pGVar4 = pGVar11->pObjs;
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        uVar5 = *(ulong *)(&pGVar4->field_0x0 + lVar12);
        if ((uVar5 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar5) {
          *(ulong *)(&pGVar4->field_0x0 + lVar12) =
               (*(uint *)((long)pGVar4 + (ulong)((uint)(uVar5 >> 0x1e) & 0x7ffffffc) * -3 + lVar12)
               | *(uint *)((long)pGVar4 +
                          (ulong)(uint)((int)(uVar5 & 0x1fffffff) << 2) * -3 + lVar12)) & 0x40000000
               | uVar5;
          pGVar11 = p->pAig;
        }
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + 0xc;
      } while (lVar13 < pGVar11->nObjs);
      pVVar10 = pNew->vCos;
    }
    if (0 < pVVar10->nSize) {
      lVar12 = 0;
      lVar13 = 0;
      do {
        iVar8 = *(int *)((long)pVVar10->pArray + lVar12 * 2);
        if (((long)iVar8 < 0) || (pNew->nObjs <= iVar8)) goto LAB_006605e6;
        if (pNew->pObjs == (Gia_Obj_t *)0x0) break;
        uVar1 = p->vXorNodes->nSize;
        if (((int)uVar1 <= (int)lVar12) || ((ulong)uVar1 <= lVar12 + 1U)) goto LAB_00660605;
        if (((undefined1  [12])pNew->pObjs[iVar8] & (undefined1  [12])0x4000000040000000) !=
            (undefined1  [12])0x4000000000000000) {
          uVar1 = p->vXorNodes->pArray[lVar12 + 1];
          if (((int)uVar1 < 0) || (p->pAig->nObjs <= (int)uVar1)) goto LAB_006605e6;
          pGVar4 = p->pAig->pObjs;
          uVar5 = *(ulong *)(pGVar4 + uVar1);
          if (((uint)uVar5 >> 0x1e & 1) == 0) {
            __assert_fail("pObjOld->fMark0 == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                          ,0xef,
                          "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                         );
          }
          pGVar4 = pGVar4 + uVar1;
          if (((pGVar4[-(ulong)((uint)uVar5 & 0x1fffffff)].field_0x3 & 0x40) == 0) &&
             ((pGVar4[-(ulong)((uint)(uVar5 >> 0x20) & 0x1fffffff)].field_0x3 & 0x40) == 0)) {
            *(ulong *)pGVar4 = uVar5 | 0x4000000000000000;
            pVVar10 = pNew->vCos;
          }
        }
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + 2;
      } while (lVar13 < pVVar10->nSize);
      pGVar11 = p->pAig;
    }
    if (0 < pGVar11->nObjs) {
      lVar12 = 0;
      lVar13 = 0;
      do {
        pGVar4 = pGVar11->pObjs;
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        uVar5 = *(ulong *)(&pGVar4->field_0x0 + lVar12);
        if ((uVar5 & 0x4000000080000000) == 0x4000000000000000 && (~(uint)uVar5 & 0x1fffffff) != 0)
        {
          *(ulong *)(&pGVar4->field_0x0 + lVar12) = uVar5 & 0xbfffffff3fffffff;
          pGVar11 = p->pAig;
        }
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + 0xc;
      } while (lVar13 < pGVar11->nObjs);
      pVVar10 = pNew->vCos;
    }
  }
  p->nAllFailed = 0;
  p->nAllProved = 0;
  p->nAllDisproved = 0;
  if (0 < pVVar10->nSize) {
    lVar13 = 0;
    lVar12 = 0;
    do {
      iVar8 = *(int *)((long)pVVar10->pArray + lVar13 * 2);
      if (((long)iVar8 < 0) || (pNew->nObjs <= iVar8)) {
LAB_006605e6:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pNew->pObjs == (Gia_Obj_t *)0x0) {
        return 0;
      }
      uVar1 = p->vXorNodes->nSize;
      if (((int)uVar1 <= (int)lVar13) || ((ulong)uVar1 <= lVar13 + 1U)) {
LAB_00660605:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar6 = p->vXorNodes->pArray;
      uVar1 = piVar6[lVar13];
      if ((int)uVar1 < 0) goto LAB_006605e6;
      pGVar11 = p->pAig;
      if (pGVar11->nObjs <= (int)uVar1) goto LAB_006605e6;
      uVar2 = piVar6[lVar13 + 1];
      if (((int)uVar2 < 0) || ((uint)pGVar11->nObjs <= uVar2)) goto LAB_006605e6;
      pGVar7 = pGVar11->pObjs;
      pGVar4 = pGVar7 + uVar1;
      uVar5 = *(ulong *)(pNew->pObjs + iVar8);
      uVar14 = (uint)uVar5;
      if ((uVar5 & 0x4000000000000000) == 0) {
        if ((uVar14 >> 0x1e & 1) == 0) {
          GVar3 = pGVar11->pReprs[uVar2];
          if (((uint)GVar3 >> 0x1d & 1) != 0) {
            __assert_fail("!Gia_ObjFailed(p->pAig, iNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                          ,0x11e,
                          "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                         );
          }
          if (((uint)GVar3 >> 0x1c & 1) != 0) {
            __assert_fail("!Gia_ObjProved(p->pAig, iNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                          ,0x11f,
                          "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                         );
          }
          pGVar11->pReprs[uVar2] = (Gia_Rpr_t)((uint)GVar3 | 0x20000000);
          p->nAllFailed = p->nAllFailed + 1;
        }
        else if (((pGVar4->field_0x3 & 0x40) == 0) && ((pGVar7[uVar2].field_0x3 & 0x40) == 0)) {
          if (uVar1 == ((uint)pGVar11->pReprs[uVar2] & 0xfffffff)) {
            Abc_Print((int)pGVar4,(char *)pGVar11);
          }
          p->nAllDisproved = p->nAllDisproved + 1;
        }
      }
      else {
        if ((uVar14 >> 0x1e & 1) != 0) {
          __assert_fail("pObj->fMark0 == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                        ,0x105,
                        "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                       );
        }
        GVar3 = pGVar11->pReprs[uVar2];
        if (((uint)GVar3 >> 0x1c & 1) != 0) {
          __assert_fail("!Gia_ObjProved(p->pAig, iNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                        ,0x106,
                        "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                       );
        }
        if (((pGVar4->field_0x3 & 0x40) == 0) && ((pGVar7[uVar2].field_0x3 & 0x40) == 0)) {
          if (uVar1 != ((uint)GVar3 & 0xfffffff)) {
            __assert_fail("iRepr == Gia_ObjRepr(p->pAig, iNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                          ,0x10a,
                          "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                         );
          }
          pGVar11->pReprs[uVar2] = (Gia_Rpr_t)((uint)GVar3 | 0x10000000);
          p->nAllProved = p->nAllProved + 1;
        }
      }
      lVar12 = lVar12 + 1;
      pVVar10 = pNew->vCos;
      lVar13 = lVar13 + 2;
    } while (lVar12 < pVVar10->nSize);
  }
  return 0;
}

Assistant:

int Cec_ManFraClassesUpdate( Cec_ManFra_t * p, Cec_ManSim_t * pSim, Cec_ManPat_t * pPat, Gia_Man_t * pNew )
{
    Vec_Ptr_t * vInfo;
    Gia_Obj_t * pObj, * pObjOld, * pReprOld;
    int i, k, iRepr, iNode;
    abctime clk;
clk = Abc_Clock();
    vInfo = Cec_ManPatCollectPatterns( pPat, Gia_ManCiNum(p->pAig), pSim->nWords );
p->timePat += Abc_Clock() - clk;
clk = Abc_Clock();
    if ( vInfo != NULL )
    {
        Gia_ManCreateValueRefs( p->pAig );
        for ( i = 0; i < pPat->nSeries; i++ )
        {
            Cec_ManFraCreateInfo( pSim, pSim->vCiSimInfo, vInfo, i );
            if ( Cec_ManSimSimulateRound( pSim, pSim->vCiSimInfo, pSim->vCoSimInfo ) )
            {
                Vec_PtrFree( vInfo );
                return 1;
            }
        }
        Vec_PtrFree( vInfo );
    }
p->timeSim += Abc_Clock() - clk;
    assert( Vec_IntSize(p->vXorNodes) == 2*Gia_ManCoNum(pNew) );
    // mark the transitive fanout of failed nodes
    if ( p->pPars->nDepthMax != 1 )
    {
        Gia_ManCleanMark0( p->pAig );
        Gia_ManCleanMark1( p->pAig );
        Gia_ManForEachCo( pNew, pObj, k )
        {
            iRepr = Vec_IntEntry( p->vXorNodes, 2*k );
            iNode = Vec_IntEntry( p->vXorNodes, 2*k+1 );
            if ( pObj->fMark0 == 0 && pObj->fMark1 == 1 ) // proved
                continue;
//            Gia_ManObj(p->pAig, iRepr)->fMark0 = 1;
            Gia_ManObj(p->pAig, iNode)->fMark0 = 1;
        }
        // mark the nodes reachable through the failed nodes
        Gia_ManForEachAnd( p->pAig, pObjOld, k )
            pObjOld->fMark0 |= (Gia_ObjFanin0(pObjOld)->fMark0 | Gia_ObjFanin1(pObjOld)->fMark0);
        // unmark the disproved nodes
        Gia_ManForEachCo( pNew, pObj, k )
        {
            iRepr = Vec_IntEntry( p->vXorNodes, 2*k );
            iNode = Vec_IntEntry( p->vXorNodes, 2*k+1 );
            if ( pObj->fMark0 == 0 && pObj->fMark1 == 1 ) // proved
                continue; 
            pObjOld = Gia_ManObj(p->pAig, iNode);
            assert( pObjOld->fMark0 == 1 );
            if ( Gia_ObjFanin0(pObjOld)->fMark0 == 0 && Gia_ObjFanin1(pObjOld)->fMark0 == 0 )
                pObjOld->fMark1 = 1;
        }
        // clean marks
        Gia_ManForEachAnd( p->pAig, pObjOld, k )
            if ( pObjOld->fMark1 )
            {
                pObjOld->fMark0 = 0;
                pObjOld->fMark1 = 0;
            }
    }
    // set the results
    p->nAllProved = p->nAllDisproved = p->nAllFailed = 0;
    Gia_ManForEachCo( pNew, pObj, k )
    {
        iRepr = Vec_IntEntry( p->vXorNodes, 2*k );
        iNode = Vec_IntEntry( p->vXorNodes, 2*k+1 );
        pReprOld = Gia_ManObj(p->pAig, iRepr);
        pObjOld = Gia_ManObj(p->pAig, iNode);
        if ( pObj->fMark1 )
        { // proved
            assert( pObj->fMark0 == 0 );
            assert( !Gia_ObjProved(p->pAig, iNode) );
            if ( pReprOld->fMark0 == 0 && pObjOld->fMark0 == 0 )
//            if ( pObjOld->fMark0 == 0 )
            {
                assert( iRepr == Gia_ObjRepr(p->pAig, iNode) );
                Gia_ObjSetProved( p->pAig, iNode );
                p->nAllProved++;
            }
        }
        else if ( pObj->fMark0 )
        { // disproved
            assert( pObj->fMark1 == 0 );
            if ( pReprOld->fMark0 == 0 && pObjOld->fMark0 == 0 )
//            if ( pObjOld->fMark0 == 0 )
            {
                if ( iRepr == Gia_ObjRepr(p->pAig, iNode) )
                    Abc_Print( 1, "Cec_ManFraClassesUpdate(): Error! Node is not refined!\n" );
                p->nAllDisproved++;
            }
        }
        else
        { // failed
            assert( pObj->fMark0 == 0 );
            assert( pObj->fMark1 == 0 );
            assert( !Gia_ObjFailed(p->pAig, iNode) );
            assert( !Gia_ObjProved(p->pAig, iNode) );
            Gia_ObjSetFailed( p->pAig, iNode );
            p->nAllFailed++;
        }
    } 
    return 0;
}